

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O1

void ge_madd(ge_p1p1 *r,ge_p3 *p,ge_precomp *q)

{
  fe_loose *h;
  fe_loose *h_00;
  fe trT;
  fe trZ;
  fe trY;
  fe fStack_a8;
  fe local_80;
  fe local_58;
  
  fe_add(&r->X,&p->Y,&p->X);
  h = &r->Y;
  fe_sub(h,&p->Y,&p->X);
  fe_mul_impl(local_80.v,(fe_limb_t *)r,(fe_limb_t *)q);
  fe_mul_impl(local_58.v,h->v,(q->yminusx).v);
  fe_mul_impl(fStack_a8.v,(q->xy2d).v,(p->T).v);
  h_00 = &r->T;
  fe_add(h_00,&p->Z,&p->Z);
  fe_sub(&r->X,&local_80,&local_58);
  fe_add(h,&local_80,&local_58);
  fe_carry(&local_80,h_00);
  fe_add(&r->Z,&local_80,&fStack_a8);
  fe_sub(h_00,&local_80,&fStack_a8);
  return;
}

Assistant:

static void ge_madd(ge_p1p1 *r, const ge_p3 *p, const ge_precomp *q) {
  fe trY, trZ, trT;

  fe_add(&r->X, &p->Y, &p->X);
  fe_sub(&r->Y, &p->Y, &p->X);
  fe_mul_tll(&trZ, &r->X, &q->yplusx);
  fe_mul_tll(&trY, &r->Y, &q->yminusx);
  fe_mul_tlt(&trT, &q->xy2d, &p->T);
  fe_add(&r->T, &p->Z, &p->Z);
  fe_sub(&r->X, &trZ, &trY);
  fe_add(&r->Y, &trZ, &trY);
  fe_carry(&trZ, &r->T);
  fe_add(&r->Z, &trZ, &trT);
  fe_sub(&r->T, &trZ, &trT);
}